

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O1

void mcmgarb(mcmcx1def *ctx)

{
  ushort uVar1;
  ushort uVar2;
  mcmodef **ppmVar3;
  mcmodef *pmVar4;
  mcmodef *pmVar5;
  ushort *p;
  ulong uVar6;
  ulong uVar7;
  mcmhdef *pmVar8;
  ushort *puVar9;
  ulong uVar10;
  ushort *__dest;
  
  pmVar8 = ctx->mcmcxhpch;
  if (pmVar8 != (mcmhdef *)0x0) {
    do {
      p = (ushort *)mcmffh(ctx,(uchar *)(pmVar8 + 1));
      if (p != (ushort *)0x0) {
        do {
          ppmVar3 = ctx->mcmcxtab;
          puVar9 = (ushort *)((long)p + (ulong)ppmVar3[*p >> 8][(byte)*p].mcmosiz + 8);
          __dest = p;
          do {
            while( true ) {
              uVar1 = *(ushort *)((long)p + (ulong)ppmVar3[*p >> 8][(byte)*p].mcmosiz + 8);
              if (uVar1 == 0xffff) goto LAB_0012cb20;
              p = (ushort *)((long)p + (ulong)ppmVar3[*p >> 8][(byte)*p].mcmosiz + 8);
              if ((ppmVar3[uVar1 >> 8][(byte)uVar1].mcmoflg & 4) == 0) break;
              p = (ushort *)mcmffh(ctx,(uchar *)p);
              __dest = p;
              if (p == (ushort *)0x0) goto LAB_0012cb20;
            }
          } while (-1 < (char)ppmVar3[uVar1 >> 8][(byte)uVar1].mcmoflg);
          if (p != puVar9) {
            uVar1 = *__dest;
            uVar6 = (ulong)((uVar1 & 0xff) << 5);
            uVar2 = *(ushort *)((long)&ppmVar3[uVar1 >> 8]->mcmosiz + uVar6);
            uVar7 = (ulong)(uVar2 + 8 & 0xffff);
            puVar9 = (ushort *)((long)p - uVar7);
            *(ushort **)((long)&ppmVar3[uVar1 >> 8]->mcmoptr + uVar6) = puVar9 + 4;
            memmove(__dest,(void *)(uVar7 + (long)__dest),(long)p - ((ulong)uVar2 + (long)__dest));
            for (; puVar9 != __dest;
                __dest = (ushort *)
                         ((long)__dest +
                         (ulong)*(ushort *)
                                 ((long)&ctx->mcmcxtab[*__dest >> 8]->mcmosiz +
                                 (ulong)((*__dest & 0xff) << 5)) + 8)) {
              *(ushort **)
               ((long)&ctx->mcmcxtab[*__dest >> 8]->mcmoptr + (ulong)((*__dest & 0xff) << 5)) =
                   __dest + 4;
            }
            *puVar9 = uVar1;
            __dest = puVar9;
          }
          pmVar4 = ctx->mcmcxtab[*__dest >> 8];
          uVar6 = (ulong)((*__dest & 0xff) << 5);
          uVar1 = *(ushort *)((long)&pmVar4->mcmosiz + uVar6);
          uVar10 = (ulong)uVar1;
          uVar2 = *(ushort *)((long)__dest + uVar10 + 8);
          pmVar5 = ctx->mcmcxtab[uVar2 >> 8];
          uVar7 = (ulong)((uVar2 & 0xff) << 5);
          *(ushort *)((long)&pmVar4->mcmosiz + uVar6) =
               *(short *)((long)&pmVar5->mcmosiz + uVar7) + uVar1 + 8;
          mcmunl(ctx,*(mcmon *)((long)__dest + uVar10 + 8),&ctx->mcmcxfre);
          *(mcmon *)((long)&pmVar5->mcmonxt + uVar7) = ctx->mcmcxunu;
          ctx->mcmcxunu = *(mcmon *)((long)__dest + uVar10 + 8);
          *(undefined2 *)((long)&pmVar5->mcmoflg + uVar7) = 0;
          p = __dest;
        } while( true );
      }
LAB_0012cb20:
      pmVar8 = pmVar8->mcmhnxt;
    } while (pmVar8 != (mcmhdef *)0x0);
  }
  return;
}

Assistant:

static void mcmgarb(mcmcx1def *ctx)
{
    mcmhdef *h;
    uchar   *p;
    uchar   *q;
    uchar   *nxt;
    ushort   flags;
    
    MCMGLBCTX(ctx);

    for (h = ctx->mcmcxhpch ; h ; h = h->mcmhnxt)
    {
        p = (uchar *)(h+1);                   /* get pointer to actual heap */
        p = mcmffh(ctx, p);                 /* get first free block in heap */
        if (!p) continue;             /* can't do anything - no free blocks */
        nxt = mcmnxh(ctx, p);              /* remember immediate next block */
        
        for (q=p ;; )
        {
            q = mcmnxh(ctx, q);                  /* find next chunk in heap */
            if (*(mcmon *)q == MCMONINV) break;      /* reached end of heap */
            assert(mcmgobje(ctx, *(mcmon *)q)->mcmoptr
                   == q + osrndsz(sizeof(mcmon)));
            flags = mcmgobje(ctx, *(mcmon *)q)->mcmoflg;       /* get flags */

            /* if the block is locked, p can't be relocated */
            if (flags & MCMOFLOCK)
            {
                p = mcmffh(ctx, q);         /* find next free block after p */
                q = p;
                if (p) continue;   /* try again; start with next free block */
                else break;         /* no more free blocks - done with heap */
            }

            /* if the block is free, we can relocate between p and q */
            if (flags & MCMOFFREE)
            {
                if (q != nxt) p = mcmreloc(ctx, p, q);          /* relocate */
                mcmconsol(ctx, p);           /* consolidate two free blocks */
                
                /* resume looking, starting with consolidated block */
                nxt = mcmnxh(ctx, p);
                q = p;
                continue;
            }
        }
    }
}